

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void __thiscall
tinygltf::PerspectiveCamera::PerspectiveCamera(PerspectiveCamera *this,PerspectiveCamera *rhs)

{
  double dVar1;
  
  dVar1 = rhs->yfov;
  this->aspectRatio = rhs->aspectRatio;
  this->yfov = dVar1;
  dVar1 = rhs->znear;
  this->zfar = rhs->zfar;
  this->znear = dVar1;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->extensions)._M_t._M_impl.super__Rb_tree_header,
             &(rhs->extensions)._M_t._M_impl.super__Rb_tree_header);
  Value::Value(&this->extras,&rhs->extras);
  return;
}

Assistant:

PerspectiveCamera(PerspectiveCamera &&rhs) noexcept
      : aspectRatio(rhs.aspectRatio),
        yfov(rhs.yfov),
        zfar(rhs.zfar),
        znear(rhs.znear),
        extensions(std::move(rhs.extensions)),
        extras(std::move(rhs.extras)) {}